

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

void __thiscall irr::video::COpenGLDriver::~COpenGLDriver(COpenGLDriver *this)

{
  ~COpenGLDriver((COpenGLDriver *)
                 ((long)&(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver +
                 (long)(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[-3]));
  return;
}

Assistant:

COpenGLDriver::~COpenGLDriver()
{
	deleteMaterialRenders();

	CacheHandler->getTextureCache().clear();
	// I get a blue screen on my laptop, when I do not delete the
	// textures manually before releasing the dc. Oh how I love this.
	removeAllRenderTargets();
	deleteAllTextures();
	removeAllOcclusionQueries();
	removeAllHardwareBuffers();

	delete CacheHandler;

	if (ContextManager) {
		ContextManager->destroyContext();
		ContextManager->destroySurface();
		ContextManager->terminate();
		ContextManager->drop();
	}
}